

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDependsFortran.cxx
# Opt level: O1

bool __thiscall
cmDependsFortran::FindIncludeFile
          (cmDependsFortran *this,char *dir,char *includeName,string *fileName)

{
  char *pcVar1;
  bool bVar2;
  pointer pbVar3;
  string fullName;
  allocator local_51;
  long *local_50 [2];
  long local_40 [2];
  
  bVar2 = cmsys::SystemTools::FileIsFullPath(includeName);
  if (bVar2) {
    pcVar1 = (char *)fileName->_M_string_length;
    strlen(includeName);
    std::__cxx11::string::_M_replace((ulong)fileName,0,pcVar1,(ulong)includeName);
    bVar2 = cmsys::SystemTools::FileExists((fileName->_M_dataplus)._M_p,true);
    return bVar2;
  }
  std::__cxx11::string::string((string *)local_50,dir,&local_51);
  std::__cxx11::string::append((char *)local_50);
  std::__cxx11::string::append((char *)local_50);
  bVar2 = cmsys::SystemTools::FileExists((char *)local_50[0],true);
  if (bVar2) {
    bVar2 = true;
    std::__cxx11::string::_M_assign((string *)fileName);
  }
  else {
    pbVar3 = (this->super_cmDepends).IncludePath.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (pbVar3 != (this->super_cmDepends).IncludePath.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      do {
        std::__cxx11::string::_M_assign((string *)local_50);
        std::__cxx11::string::append((char *)local_50);
        std::__cxx11::string::append((char *)local_50);
        bVar2 = cmsys::SystemTools::FileExists((char *)local_50[0],true);
        if (bVar2) {
          bVar2 = true;
          std::__cxx11::string::_M_assign((string *)fileName);
          goto LAB_004252f1;
        }
        pbVar3 = pbVar3 + 1;
      } while (pbVar3 != (this->super_cmDepends).IncludePath.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    }
    bVar2 = false;
  }
LAB_004252f1:
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  return bVar2;
}

Assistant:

bool cmDependsFortran::FindIncludeFile(const char* dir,
                                       const char* includeName,
                                       std::string& fileName)
{
  // If the file is a full path, include it directly.
  if(cmSystemTools::FileIsFullPath(includeName))
    {
    fileName = includeName;
    return cmSystemTools::FileExists(fileName.c_str(), true);
    }
  else
    {
    // Check for the file in the directory containing the including
    // file.
    std::string fullName = dir;
    fullName += "/";
    fullName += includeName;
    if(cmSystemTools::FileExists(fullName.c_str(), true))
      {
      fileName = fullName;
      return true;
      }

    // Search the include path for the file.
    for(std::vector<std::string>::const_iterator i =
          this->IncludePath.begin(); i != this->IncludePath.end(); ++i)
      {
      fullName = *i;
      fullName += "/";
      fullName += includeName;
      if(cmSystemTools::FileExists(fullName.c_str(), true))
        {
        fileName = fullName;
        return true;
        }
      }
    }
  return false;
}